

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O3

REF_STATUS
ref_oct_set_node_at_node
          (REF_OCT ref_oct,REF_INT node,REF_DBL *bbox,REF_INT insert_node,REF_DBL *xyz)

{
  REF_STATUS RVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  REF_DBL box [6];
  double local_68;
  double dStack_60;
  double local_58;
  
  dVar5 = bbox[1] - *bbox;
  if ((dVar5 * -0.0050000000000000044 + *bbox <= *xyz) &&
     (*xyz <= dVar5 * 0.0050000000000000044 + bbox[1])) {
    dVar6 = bbox[3] - bbox[2];
    if ((dVar6 * -0.0050000000000000044 + bbox[2] <= xyz[1]) &&
       (xyz[1] <= dVar6 * 0.0050000000000000044 + bbox[3])) {
      dVar7 = bbox[5] - bbox[4];
      if ((dVar7 * -0.0050000000000000044 + bbox[4] <= xyz[2]) &&
         (xyz[2] <= dVar7 * 0.0050000000000000044 + bbox[5])) {
        if (ref_oct->children[node * 8] == -1) {
          lVar4 = 0;
          do {
            RVar1 = ref_oct_bbox_corner(bbox,(REF_INT)lVar4,&local_68);
            if (RVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                     ,0x1b6,"ref_oct_set_node_at_node",1,"corner xyz");
              return 1;
            }
            if (SQRT((xyz[2] - local_58) * (xyz[2] - local_58) +
                     (xyz[1] - dStack_60) * (xyz[1] - dStack_60) +
                     (*xyz - local_68) * (*xyz - local_68)) <
                SQRT(dVar7 * dVar7 + dVar6 * dVar6 + dVar5 * dVar5) * 0.1) {
              ref_oct->nodes[node * 0x1b + lVar4] = insert_node;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 != 0x1b);
        }
        else {
          lVar4 = 0;
          do {
            RVar1 = ref_oct_child_bbox(bbox,(REF_INT)lVar4,&local_68);
            if (RVar1 != 0) {
              pcVar3 = "bbox";
              uVar2 = 0x1c1;
LAB_001772bb:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                     ,uVar2,"ref_oct_set_node_at_node",1,pcVar3);
              return 1;
            }
            if (ref_oct->children[node * 8 + lVar4] == node) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                     ,0x1c2,"ref_oct_set_node_at_node","same");
              return 1;
            }
            RVar1 = ref_oct_set_node_at_node
                              (ref_oct,ref_oct->children[node * 8 + lVar4],&local_68,insert_node,xyz
                              );
            if (RVar1 != 0) {
              pcVar3 = "recurse";
              uVar2 = 0x1c6;
              goto LAB_001772bb;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 != 8);
        }
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_oct_set_node_at_node(REF_OCT ref_oct,
                                                   REF_INT node, REF_DBL *bbox,
                                                   REF_INT insert_node,
                                                   REF_DBL *xyz) {
  REF_DBL fuzz[6], point[6], expand = 1.01;
  REF_BOOL overlap;

  point[0] = xyz[0];
  point[1] = xyz[0];
  point[2] = xyz[1];
  point[3] = xyz[1];
  point[4] = xyz[2];
  point[5] = xyz[2];
  RSS(ref_oct_bbox_scale(bbox, expand, fuzz), "scale bbox");
  RSS(ref_oct_bbox_overlap(point, fuzz, &overlap), "overlap");
  if (!overlap) return REF_SUCCESS;

  if (ref_oct_leaf_node(ref_oct, node)) {
    REF_INT corner;
    REF_DBL h;
    RSS(ref_oct_bbox_diag(bbox, &h), "diag");
    for (corner = 0; corner < 27; corner++) {
      REF_DBL my_xyz[3], dist, tol = 0.1;
      RSS(ref_oct_bbox_corner(bbox, corner, my_xyz), "corner xyz");
      dist = sqrt(pow(xyz[0] - my_xyz[0], 2) + pow(xyz[1] - my_xyz[1], 2) +
                  pow(xyz[2] - my_xyz[2], 2));
      if (dist < tol * h) {
        ref_oct_c2n(ref_oct, corner, node) = insert_node;
      }
    }
  } else {
    REF_INT child_index;
    for (child_index = 0; child_index < 8; child_index++) {
      REF_DBL box[6];
      RSS(ref_oct_child_bbox(bbox, child_index, box), "bbox");
      RUS(node, ref_oct_child(ref_oct, child_index, node), "same");
      RSS(ref_oct_set_node_at_node(ref_oct,
                                   ref_oct_child(ref_oct, child_index, node),
                                   box, insert_node, xyz),
          "recurse");
    }
  }
  return REF_SUCCESS;
}